

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::InsertOneLoopProbe(Lowerer *this,Instr *insertInstr,LabelInstr *loopLabel)

{
  IRKind IVar1;
  Func *func;
  code *pcVar2;
  RegNum reg;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  MemRefOpnd *compareSrc2;
  RegOpnd *compareSrc1;
  LabelInstr *pLVar6;
  HelperCallOpnd *this_00;
  Instr *instr;
  undefined4 *puVar7;
  BranchInstr *instr_00;
  Lowerer *this_01;
  
  iVar5 = (*this->m_func->m_threadContextInfo->_vptr_ThreadContextInfo[3])();
  compareSrc2 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar5),TyInt64,this->m_func,
                                    AddrOpndKindDynamicMisc);
  reg = LowererMDArch::GetRegStackPointer();
  this_01 = (Lowerer *)0x0;
  compareSrc1 = IR::RegOpnd::New((StackSym *)0x0,reg,TyInt64,this->m_func);
  InsertCompareBranch(this_01,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,BrGt_A,false,
                      loopLabel,insertInstr,false);
  pLVar6 = IR::LabelInstr::New(Label,this->m_func,true);
  IR::Instr::InsertBefore(insertInstr,&pLVar6->super_Instr);
  this_00 = IR::HelperCallOpnd::New(HelperScriptAbort,this->m_func);
  instr = IR::Instr::New(Call,this->m_func);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005c6874;
    *puVar7 = 0;
  }
  func = instr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005c6874:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,func);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &this_00->super_Opnd;
  IR::Instr::InsertBefore(insertInstr,instr);
  LowererMD::LowerCall(&this->m_lowererMD,instr,0);
  pLVar6 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(this->m_func->m_exitInstr);
  IVar1 = (pLVar6->super_Instr).m_kind;
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    pLVar6 = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertBefore(this->m_func->m_exitInstr,&pLVar6->super_Instr);
  }
  instr_00 = IR::BranchInstr::New(JMP,pLVar6,this->m_func);
  IR::Instr::InsertBefore(insertInstr,&instr_00->super_Instr);
  return;
}

Assistant:

void
Lowerer::InsertOneLoopProbe(IR::Instr *insertInstr, IR::LabelInstr *loopLabel)
{
    // Insert one interrupt probe at the given instruction. Probe the stack and call the abort helper
    // directly if the probe fails.

    IR::Opnd *memRefOpnd = IR::MemRefOpnd::New(
        m_func->GetThreadContextInfo()->GetThreadStackLimitAddr(),
        TyMachReg, this->m_func);

    IR::RegOpnd *regStackPointer = IR::RegOpnd::New(
        NULL, this->m_lowererMD.GetRegStackPointer(), TyMachReg, this->m_func);

    InsertCompareBranch(regStackPointer, memRefOpnd, Js::OpCode::BrGt_A, loopLabel, insertInstr);

    IR::LabelInstr *helperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    insertInstr->InsertBefore(helperLabel);

    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(IR::HelperScriptAbort, this->m_func);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Call, this->m_func);
    instr->SetSrc1(helperOpnd);
    insertInstr->InsertBefore(instr);
    this->m_lowererMD.LowerCall(instr, 0);

    // Jump to the exit after the helper call. This instruction will never be reached, but the jump
    // indicates that nothing is live after the call (to avoid useless spills in code that will
    // be executed).
    instr = this->m_func->m_exitInstr->GetPrevRealInstrOrLabel();
    if (instr->IsLabelInstr())
    {
        helperLabel = instr->AsLabelInstr();
    }
    else
    {
        helperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        this->m_func->m_exitInstr->InsertBefore(helperLabel);
    }

    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, helperLabel, this->m_func);
    insertInstr->InsertBefore(instr);
}